

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaseNode.cpp
# Opt level: O0

int DefaultComparer<CaseNode_*>::Compare(CaseNode *caseNode1,CaseNode *caseNode2)

{
  int32 iVar1;
  int32 iVar2;
  uint32 uVar3;
  uint32 uVar4;
  uint32 caseOffset2;
  uint32 caseOffset1;
  int caseVal2;
  int caseVal1;
  CaseNode *caseNode2_local;
  CaseNode *caseNode1_local;
  
  iVar1 = CaseNode::GetUpperBoundIntConst(caseNode1);
  iVar2 = CaseNode::GetUpperBoundIntConst(caseNode2);
  uVar3 = CaseNode::GetOffset(caseNode1);
  uVar4 = CaseNode::GetOffset(caseNode2);
  if (iVar1 == iVar2) {
    caseNode1_local._4_4_ = uVar3 - uVar4;
  }
  else if (iVar2 < iVar1) {
    caseNode1_local._4_4_ = 1;
  }
  else {
    caseNode1_local._4_4_ = -1;
  }
  return caseNode1_local._4_4_;
}

Assistant:

int
DefaultComparer<CaseNode *>::Compare(CaseNode* caseNode1, CaseNode* caseNode2)
{
    int caseVal1 = caseNode1->GetUpperBoundIntConst();
    int caseVal2 = caseNode2->GetUpperBoundIntConst();
    uint32 caseOffset1 = caseNode1->GetOffset();
    uint32 caseOffset2 = caseNode2->GetOffset();

    if (caseVal1 == caseVal2)
    {
        return caseOffset1 - caseOffset2;
    }

    if (caseVal1 > caseVal2) return 1;
    return -1;
}